

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# purearray.cpp
# Opt level: O2

void __thiscall PureArray::setValue(PureArray *this,int v)

{
  int i;
  uint uVar1;
  int j;
  ulong uVar2;
  
  for (uVar1 = 0; (int)uVar1 < (this->super_Array)._height; uVar1 = uVar1 + 1) {
    for (uVar2 = 0; (int)uVar2 < (this->super_Array)._width; uVar2 = (ulong)((int)uVar2 + 1)) {
      (*(this->super_Array)._vptr_Array[3])(this,v,uVar2,(ulong)uVar1);
    }
  }
  return;
}

Assistant:

void PureArray::setValue(int v)
{
	for (int i = 0; i < getHeight(); ++i) {
		for (int j = 0; j < getWidth(); ++j) {
			setData(v, j, i);
		}
	}
}